

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  char *in_RDX;
  char *local_88;
  allocator local_51;
  string local_50 [32];
  auto_ptr_ref<cmCompiledGeneratorExpression> local_28;
  char *input_local;
  cmGeneratorExpression *this_local;
  
  local_88 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_88 = "";
  }
  input_local = input;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_88,&local_51);
  Parse((cmGeneratorExpression *)&stack0xffffffffffffffd0,(string *)input);
  local_28 = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&stack0xffffffffffffffd0);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)this,local_28);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

CM_AUTO_PTR<cmCompiledGeneratorExpression> cmGeneratorExpression::Parse(
  const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}